

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,DefParamSyntax *syntax)

{
  long in_RDI;
  DefParamSyntax *in_stack_00000028;
  SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *in_stack_00000030;
  
  *(undefined1 *)(in_RDI + 0xd0) = 1;
  slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
  visitDefault<slang::syntax::DefParamSyntax_const&>(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void handle(const DefParamSyntax& syntax) {
        meta.hasDefparams = true;
        visitDefault(syntax);
    }